

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<std::istream,short,unsigned_int>
               (ImputeNode *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  bool bVar1;
  size_t n_els;
  long in_RDI;
  vector<double,_std::allocator<double>_> *v;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t veclen;
  size_t data_sizets [5];
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  istream *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  long local_30;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_int>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (istream *)in_stack_ffffffffffffffa0._M_current,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff98._M_current,
               SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
    *(undefined8 *)(in_RDI + 0x60) = local_48;
    read_bytes<double,double>
              (in_stack_ffffffffffffffa0._M_current,(size_t)in_stack_ffffffffffffff98._M_current,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,false);
    read_bytes<double,double>
              (in_stack_ffffffffffffffa0._M_current,(size_t)in_stack_ffffffffffffff98._M_current,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,false);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (local_30 != 0) {
      n_els = in_RDI + 0x30;
      in_stack_ffffffffffffffa0 =
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff98 =
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                 *)in_stack_ffffffffffffff88), bVar1) {
        in_stack_ffffffffffffff90 =
             (istream *)
             __gnu_cxx::
             __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator*((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)&stack0xffffffffffffffa0);
        read_bytes<unsigned_long,unsigned_int>
                  (in_stack_ffffffffffffffb0,n_els,(istream *)in_stack_ffffffffffffffa0._M_current,
                   (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff98._M_current,
                   SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
        read_bytes<double,double>
                  (in_stack_ffffffffffffffa0._M_current,(size_t)in_stack_ffffffffffffff98._M_current
                   ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,false);
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                      *)&stack0xffffffffffffffa0);
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::shrink_to_fit((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)0x67a3d8);
    read_bytes<double,double>
              (in_stack_ffffffffffffffa0._M_current,(size_t)in_stack_ffffffffffffff98._M_current,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,false);
  }
  return;
}

Assistant:

void deserialize_node(ImputeNode &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t data_sizets[5];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)5, in, buffer, diff_endian);
    node.parent = data_sizets[0];

    read_bytes<double, double>(node.num_sum, data_sizets[1], in, buffer, diff_endian);

    read_bytes<double, double>(node.num_weight, data_sizets[2], in, buffer, diff_endian);

    node.cat_sum.resize(data_sizets[3]);
    if (data_sizets[3]) {
        size_t veclen;
        for (auto &v : node.cat_sum) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
            read_bytes<double, double>(v, veclen, in, buffer, diff_endian);
        }
    }
    node.cat_sum.shrink_to_fit();

    read_bytes<double, double>(node.cat_weight, data_sizets[4], in, buffer, diff_endian);
}